

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  OPJ_INT32 *pOVar3;
  uint uVar4;
  FILE *pFVar5;
  size_t sVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  OPJ_UINT32 *pOVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  uint *puVar19;
  uint local_88;
  uint *local_70;
  uint *local_68;
  int local_60;
  int local_5c;
  
  poVar2 = image->comps;
  OVar1 = poVar2->prec;
  pcVar16 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar8 = pcVar16;
      pcVar16 = pcVar8 + 1;
    } while (*pcVar8 != '\0');
    uVar13 = image->numcomps;
    uVar11 = 1;
    if ((pcVar8[-2] & 0xdfU) != 0x47) {
      uVar11 = (ulong)uVar13;
    }
    local_88 = (uint)uVar11;
    if ((force_split == 0) && (1 < local_88)) {
      if (1 < uVar13) {
        pOVar12 = &poVar2[1].sgnd;
        uVar15 = 1;
        do {
          if (((poVar2->dx != ((opj_image_comp_t *)(pOVar12 + -8))->dx) ||
              (poVar2->dy != pOVar12[-7])) ||
             ((uVar15 < 3 && ((OVar1 != pOVar12[-2] || (poVar2->sgnd != *pOVar12))))))
          goto LAB_0010b84c;
          uVar15 = uVar15 + 1;
          pOVar12 = pOVar12 + 0x10;
        } while (uVar13 != uVar15);
      }
      pFVar5 = fopen(outfile,"wb");
      if (pFVar5 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        goto LAB_0010be6b;
      }
      poVar2 = image->comps;
      if (local_88 < 3) {
        local_68 = (uint *)0x0;
        local_70 = (uint *)0x0;
      }
      else {
        local_70 = (uint *)poVar2[1].data;
        local_68 = (uint *)poVar2[2].data;
      }
      uVar13 = poVar2->w;
      uVar4 = poVar2->h;
      uVar10 = ~(-1 << ((byte)OVar1 & 0x1f));
      pOVar3 = poVar2->data;
      if ((local_88 == 4) || (local_88 == 2)) {
        pcVar16 = "GRAYSCALE_ALPHA";
        if (2 < local_88) {
          pcVar16 = "RGB_ALPHA";
        }
        uVar7 = opj_version();
        fprintf(pFVar5,
                "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                ,uVar7,(ulong)uVar13,(ulong)uVar4,uVar11,(ulong)uVar10,pcVar16);
        poVar2 = image->comps;
        uVar10 = local_88 - 1;
        puVar19 = (uint *)poVar2[uVar10].data;
        if (poVar2[uVar10].sgnd == 0) {
          iVar18 = 0;
        }
        else {
          iVar18 = 1 << ((char)poVar2[uVar10].prec - 1U & 0x1f);
        }
      }
      else {
        uVar7 = opj_version();
        iVar18 = 0;
        fprintf(pFVar5,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar13,(ulong)uVar4,
                (ulong)uVar10);
        puVar19 = (uint *)0x0;
      }
      poVar2 = image->comps;
      local_5c = 0;
      iVar9 = 0;
      if (poVar2->sgnd != 0) {
        iVar9 = 1 << ((char)poVar2->prec - 1U & 0x1f);
      }
      local_60 = 0;
      if (2 < local_88) {
        local_60 = 0;
        local_5c = 0;
        if (poVar2[1].sgnd != 0) {
          local_5c = 1 << ((char)poVar2[1].prec - 1U & 0x1f);
        }
        if (poVar2[2].sgnd != 0) {
          local_60 = 1 << ((char)poVar2[2].prec - 1U & 0x1f);
        }
      }
      if (0 < (int)(uVar4 * uVar13)) {
        lVar17 = 0;
        do {
          uVar10 = pOVar3[lVar17];
          if ((int)OVar1 < 9) {
            uVar14 = 0;
            if (0 < (int)uVar10) {
              uVar14 = uVar10;
            }
            uVar14 = uVar14 & 0xff;
            if (0xff < (int)uVar10) {
              uVar14 = 0xff;
            }
            fputc(uVar14,pFVar5);
            if (2 < local_88) {
              uVar10 = *local_70;
              local_70 = local_70 + 1;
              uVar14 = 0;
              if (0 < (int)uVar10) {
                uVar14 = uVar10;
              }
              uVar14 = uVar14 & 0xff;
              if (0xff < (int)uVar10) {
                uVar14 = 0xff;
              }
              fputc(uVar14,pFVar5);
              uVar10 = *local_68;
              local_68 = local_68 + 1;
              uVar14 = 0;
              if (0 < (int)uVar10) {
                uVar14 = uVar10;
              }
              uVar14 = uVar14 & 0xff;
              if (0xff < (int)uVar10) {
                uVar14 = 0xff;
              }
              fputc(uVar14,pFVar5);
            }
            if ((local_88 == 4) || (local_88 == 2)) {
              uVar10 = *puVar19;
              puVar19 = puVar19 + 1;
              uVar14 = 0;
              if (0 < (int)uVar10) {
                uVar14 = uVar10;
              }
              uVar14 = uVar14 & 0xff;
              if (0xff < (int)uVar10) {
                uVar14 = 0xff;
              }
              fputc(uVar14,pFVar5);
            }
          }
          else {
            uVar10 = uVar10 + iVar9;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfffe < (int)uVar10) {
              uVar10 = 0xffff;
            }
            fprintf(pFVar5,"%c%c",(ulong)(uVar10 >> 8));
            if (2 < local_88) {
              uVar10 = *local_70 + local_5c;
              local_70 = local_70 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar5,"%c%c",(ulong)(uVar10 >> 8),(ulong)(uVar10 & 0xff));
              uVar10 = *local_68 + local_60;
              local_68 = local_68 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar5,"%c%c",(ulong)(uVar10 >> 8));
            }
            if ((local_88 == 4) || (local_88 == 2)) {
              uVar10 = *puVar19 + iVar18;
              puVar19 = puVar19 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              uVar11 = (ulong)uVar10;
              if (0xfffe < (int)uVar10) {
                uVar11 = 0xffff;
              }
              fprintf(pFVar5,"%c%c",uVar11 >> 8);
            }
          }
          lVar17 = lVar17 + 1;
        } while (uVar4 * uVar13 != (int)lVar17);
      }
      fclose(pFVar5);
    }
    else {
LAB_0010b84c:
      if (local_88 < uVar13) {
        imagetopnm_cold_1();
      }
      sVar6 = strlen(outfile);
      pcVar16 = (char *)malloc(sVar6 + 8);
      if (pcVar16 == (char *)0x0) {
        imagetopnm_cold_3();
        goto LAB_0010be6b;
      }
      if (local_88 != 0) {
        uVar15 = 0;
        do {
          if (local_88 < 2) {
            strcpy(pcVar16,outfile);
          }
          else {
            sVar6 = strlen(outfile);
            strncpy(pcVar16,outfile,sVar6 - 4);
            sprintf(pcVar16 + (sVar6 - 4),"_%u.pgm",uVar15 & 0xffffffff);
          }
          pFVar5 = fopen(pcVar16,"wb");
          if (pFVar5 == (FILE *)0x0) {
            imagetopnm_cold_2();
            goto LAB_0010be6b;
          }
          poVar2 = image->comps;
          uVar13 = poVar2[uVar15].w;
          uVar4 = poVar2[uVar15].h;
          OVar1 = poVar2[uVar15].prec;
          uVar7 = opj_version();
          fprintf(pFVar5,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar13,(ulong)uVar4,
                  (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
          poVar2 = image->comps;
          pOVar3 = poVar2[uVar15].data;
          if (pOVar3 != (OPJ_INT32 *)0x0) {
            if (poVar2[uVar15].sgnd == 0) {
              iVar18 = 0;
            }
            else {
              iVar18 = 1 << ((char)poVar2[uVar15].prec - 1U & 0x1f);
            }
            iVar9 = uVar4 * uVar13;
            if ((int)OVar1 < 9) {
              if (0 < iVar9) {
                lVar17 = 0;
                do {
                  uVar4 = pOVar3[lVar17] + iVar18;
                  uVar13 = 0;
                  if (0 < (int)uVar4) {
                    uVar13 = uVar4;
                  }
                  uVar13 = uVar13 & 0xff;
                  if (0xff < (int)uVar4) {
                    uVar13 = 0xff;
                  }
                  fputc(uVar13,pFVar5);
                  lVar17 = lVar17 + 1;
                } while (iVar9 != (int)lVar17);
              }
            }
            else if (0 < iVar9) {
              lVar17 = 0;
              do {
                uVar13 = pOVar3[lVar17] + iVar18;
                if (pOVar3[lVar17] + iVar18 < 1) {
                  uVar13 = 0;
                }
                if (0xfffe < (int)uVar13) {
                  uVar13 = 0xffff;
                }
                fprintf(pFVar5,"%c%c",(ulong)(uVar13 >> 8),(ulong)uVar13 & 0xff);
                lVar17 = lVar17 + 1;
              } while (iVar9 != (int)lVar17);
            }
          }
          fclose(pFVar5);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar11);
      }
      free(pcVar16);
    }
    iVar18 = 0;
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/bin/jp2/convert.c"
            ,0x7f4,OVar1);
LAB_0010be6b:
    iVar18 = 1;
  }
  return iVar18;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if ((prec = (int)image->comps[0].prec) > 16) {
        fprintf(stderr, "%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n", __FILE__, __LINE__, prec);
        return 1;
    }
    two = has_alpha = 0;
    fails = 1;
    ncomp = image->numcomps;

    while (*tmp) {
        ++tmp;
    }
    tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if (want_gray) {
        ncomp = 1;
    }

    if ((force_split == 0) && ncomp >= 2 &&
            are_comps_similar(image)) {
        fdest = fopen(outfile, "wb");

        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w;
        hr = (int)image->comps[0].h;
        max = (1 << prec) - 1;
        has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if (triple) {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        } else {
            green = blue = NULL;
        }

        if (has_alpha) {
            const char *tt = (triple ? "RGB_ALPHA" : "GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                       1 << (image->comps[ncomp - 1].prec - 1) : 0);
        } else {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if (triple) {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        } else {
            adjustG = adjustB = 0;
        }

        for (i = 0; i < wr * hr; ++i) {
            if (two) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (triple) {
                    v = *green + adjustG;
                    ++green;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                    v =  *blue + adjustB;
                    ++blue;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                }/* if(triple) */

                if (has_alpha) {
                    v = *alpha + adjustA;
                    ++alpha;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
                continue;

            }   /* if(two) */

            /* prec <= 8: */
            v = *red++;
            if (v > 255) {
                v = 255;
            } else if (v < 0) {
                v = 0;
            }

            fprintf(fdest, "%c", (unsigned char)v);
            if (triple) {
                v = *green++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
            if (has_alpha) {
                v = *alpha++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }   /* for(i */

        fclose(fdest);
        return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp) {
        fprintf(stderr, "WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr, "           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if (destname == NULL) {
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++) {
        if (ncomp > 1) {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname + dotpos, "_%u.pgm", compno);
        } else {
            sprintf(destname, "%s", outfile);
        }

        fdest = fopen(destname, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w;
        hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1 << prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        if (!red) {
            fclose(fdest);
            continue;
        }

        adjustR =
            (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if (prec > 8) {
            for (i = 0; i < wr * hr; i++) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (has_alpha) {
                    v = *alpha++;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
            }/* for(i */
        } else { /* prec <= 8 */
            for (i = 0; i < wr * hr; ++i) {
                v = *red + adjustR;
                ++red;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}